

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

EnumVal * __thiscall flatbuffers::EnumDef::FindByValue(EnumDef *this,string *constant)

{
  char *pcVar1;
  char *str;
  bool bVar2;
  char *pcVar3;
  pointer ppEVar4;
  int64_t i64;
  uint64_t u64;
  unsigned_long local_28;
  unsigned_long local_20;
  
  if ((this->underlying_type).base_type == BASE_TYPE_ULONG) {
    str = (constant->_M_dataplus)._M_p;
    bVar2 = StringToIntegerImpl<unsigned_long>(&local_20,str,0,true);
    local_28 = local_20;
    if (bVar2) {
      if (local_20 != 0) {
        pcVar3 = str + -1;
        do {
          pcVar1 = pcVar3 + 1;
          pcVar3 = pcVar3 + 1;
          if (*pcVar1 == '\0') break;
        } while (9 < (int)*pcVar1 - 0x30U);
        if (pcVar3[-(ulong)(str < pcVar3)] == '-') {
          local_28 = 0xffffffffffffffff;
          goto LAB_0011c13e;
        }
      }
LAB_0011c10d:
      ppEVar4 = (this->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (ppEVar4 ==
            (this->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          return (EnumVal *)0x0;
        }
        if ((*ppEVar4)->value == local_20) break;
        ppEVar4 = ppEVar4 + 1;
      }
      return *ppEVar4;
    }
  }
  else {
    bVar2 = StringToIntegerImpl<long>((long *)&local_28,(constant->_M_dataplus)._M_p,0,true);
    local_20 = local_28;
    if (bVar2) goto LAB_0011c10d;
  }
LAB_0011c13e:
  __assert_fail("done",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0x916,"EnumVal *flatbuffers::EnumDef::FindByValue(const std::string &) const");
}

Assistant:

EnumVal *EnumDef::FindByValue(const std::string &constant) const {
  int64_t i64;
  auto done = false;
  if (IsUInt64()) {
    uint64_t u64;  // avoid reinterpret_cast of pointers
    done = StringToNumber(constant.c_str(), &u64);
    i64 = static_cast<int64_t>(u64);
  } else {
    done = StringToNumber(constant.c_str(), &i64);
  }
  FLATBUFFERS_ASSERT(done);
  if (!done) return nullptr;
  return ReverseLookup(i64, false);
}